

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

void tb_jmp_unlink(TranslationBlock_conflict *dest)

{
  ulong uVar1;
  bool bVar2;
  ulong local_38;
  uint local_1c;
  TranslationBlock_conflict *pTStack_18;
  int n;
  TranslationBlock_conflict *tb;
  TranslationBlock_conflict *dest_local;
  
  local_1c = (uint)dest->jmp_list_head;
  uVar1 = dest->jmp_list_head;
  while( true ) {
    pTStack_18 = (TranslationBlock_conflict *)(uVar1 & 0xfffffffffffffffe);
    local_1c = local_1c & 1;
    if (pTStack_18 == (TranslationBlock_conflict *)0x0) break;
    tb_reset_jump(pTStack_18,local_1c);
    local_38 = pTStack_18->jmp_dest[(int)local_1c];
    do {
      LOCK();
      uVar1 = pTStack_18->jmp_dest[(int)local_1c];
      bVar2 = local_38 == uVar1;
      if (bVar2) {
        pTStack_18->jmp_dest[(int)local_1c] = local_38 & 1;
        uVar1 = local_38;
      }
      UNLOCK();
      local_38 = uVar1;
    } while (!bVar2);
    uVar1 = pTStack_18->jmp_list_next[(int)local_1c];
    local_1c = (uint)uVar1;
  }
  dest->jmp_list_head = 0;
  return;
}

Assistant:

static inline void tb_jmp_unlink(TranslationBlock *dest)
{
    TranslationBlock *tb;
    int n;

    TB_FOR_EACH_JMP(dest, tb, n) {
        tb_reset_jump(tb, n);
#ifdef _MSC_VER
        atomic_and((long *)&tb->jmp_dest[n], (uintptr_t)NULL | 1);
#else
        atomic_and(&tb->jmp_dest[n], (uintptr_t)NULL | 1);
#endif
        /* No need to clear the list entry; setting the dest ptr is enough */
    }
    dest->jmp_list_head = (uintptr_t)NULL;
}